

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdk.cpp
# Opt level: O1

float SDK::distanceTo(Vec2 start,Vec2 end)

{
  Router *this;
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  vector<Vec2,_std::allocator<Vec2>_> path;
  float local_48;
  float fStack_44;
  vector<Vec2,_std::allocator<Vec2>_> local_30;
  undefined1 local_18 [16];
  
  local_18._8_4_ = in_XMM1_Dc;
  local_18._0_8_ = end;
  local_18._12_4_ = in_XMM1_Dd;
  this = Router::getInstance();
  Router::Route(&local_30,this,start,(Vec2)local_18._0_8_);
  if (local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    fVar2 = 1e+08;
  }
  else {
    local_48 = start.x;
    fStack_44 = start.y;
    local_48 = (local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start)->x - local_48;
    fStack_44 = (local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                 super__Vector_impl_data._M_start)->y - fStack_44;
    fVar2 = local_48 * local_48 + fStack_44 * fStack_44;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    if (8 < (ulong)((long)local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      uVar1 = 1;
      do {
        fVar3 = local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1].x -
                local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1 - 1].x;
        fVar4 = local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1].y -
                local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1 - 1].y;
        fVar3 = fVar3 * fVar3 + fVar4 * fVar4;
        if (fVar3 < 0.0) {
          fVar3 = sqrtf(fVar3);
        }
        else {
          fVar3 = SQRT(fVar3);
        }
        fVar2 = fVar2 + fVar3;
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  if (local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return fVar2;
}

Assistant:

float SDK::distanceTo(Vec2 start, Vec2 end)
{
    auto path = routeTo(start, end);
    if (path.empty())
        return FINF;
    float res = (path[0] - start).length();
    for (int i = 1; i < path.size(); ++i)
        res += (path[i] - path[i - 1]).length();
    return res;
}